

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TraverseSchema.cpp
# Opt level: O0

XMLCh * __thiscall
xercesc_4_0::TraverseSchema::traverseNotationDecl(TraverseSchema *this,DOMElement *elem)

{
  XMLStringPool *pXVar1;
  RefHash2KeysTableOf<char16_t,_xercesc_4_0::StringHasher> *this_00;
  SchemaInfo *rootElem;
  uint uVar2;
  int iVar3;
  XMLSize_t XVar4;
  DOMElement *pDVar5;
  XMLCh *pubId;
  XMLCh *sysId;
  undefined4 extraout_var;
  XMLNotationDecl *this_01;
  XSAnnotation *pXVar6;
  bool bVar7;
  XMLNotationDecl *decl;
  XMLCh *systemId;
  XMLCh *publicId;
  bool nameEmpty;
  XMLCh *name;
  undefined1 local_30 [8];
  NamespaceScopeManager nsMgr;
  DOMElement *elem_local;
  TraverseSchema *this_local;
  
  nsMgr.fSchemaInfo = (SchemaInfo *)elem;
  NamespaceScopeManager::NamespaceScopeManager
            ((NamespaceScopeManager *)local_30,elem,this->fSchemaInfo,this);
  GeneralAttributeCheck::checkAttributes
            (&this->fAttributeCheck,(DOMElement *)nsMgr.fSchemaInfo,0x24,this,true,
             this->fNonXSAttList);
  this_local = (TraverseSchema *)
               getElementAttValue(this,(DOMElement *)nsMgr.fSchemaInfo,
                                  (XMLCh *)SchemaSymbols::fgATT_NAME,NCName);
  bVar7 = true;
  if (this_local != (TraverseSchema *)0x0) {
    bVar7 = *(XMLCh *)this_local == L'\0';
  }
  if (bVar7) {
    reportSchemaError(this,(DOMElement *)nsMgr.fSchemaInfo,(XMLCh *)XMLUni::fgXMLErrDomain,0x55,
                      (XMLCh *)SchemaSymbols::fgELT_NOTATION,(XMLCh *)0x0,(XMLCh *)0x0,(XMLCh *)0x0)
    ;
    this_local = (TraverseSchema *)0x0;
  }
  else {
    XVar4 = XMLString::stringLen((XMLCh *)this_local);
    bVar7 = XMLChar1_0::isValidNCName((XMLCh *)this_local,XVar4);
    if (bVar7) {
      bVar7 = RefHash2KeysTableOf<char16_t,_xercesc_4_0::StringHasher>::containsKey
                        (this->fNotationRegistry,this_local,this->fTargetNSURI);
      rootElem = nsMgr.fSchemaInfo;
      if (!bVar7) {
        pDVar5 = XUtil::getFirstChildElement((DOMNode *)nsMgr.fSchemaInfo);
        pDVar5 = checkContent(this,(DOMElement *)rootElem,pDVar5,true,true);
        if (pDVar5 != (DOMElement *)0x0) {
          reportSchemaError(this,(DOMElement *)nsMgr.fSchemaInfo,(XMLCh *)XMLUni::fgXMLErrDomain,
                            0x4d);
        }
        pubId = getElementAttValue(this,(DOMElement *)nsMgr.fSchemaInfo,
                                   (XMLCh *)SchemaSymbols::fgATT_PUBLIC,UnKnown);
        sysId = getElementAttValue(this,(DOMElement *)nsMgr.fSchemaInfo,
                                   (XMLCh *)SchemaSymbols::fgATT_SYSTEM,AnyURI);
        pXVar1 = this->fStringPool;
        this_00 = this->fNotationRegistry;
        uVar2 = (*(pXVar1->super_XSerializable)._vptr_XSerializable[5])(pXVar1,this_local);
        iVar3 = (*(pXVar1->super_XSerializable)._vptr_XSerializable[10])(pXVar1,(ulong)uVar2);
        RefHash2KeysTableOf<char16_t,_xercesc_4_0::StringHasher>::put
                  (this_00,(void *)CONCAT44(extraout_var,iVar3),this->fTargetNSURI,(char16_t *)0x0);
        this_01 = (XMLNotationDecl *)XMemory::operator_new(0x40,this->fGrammarPoolMemoryManager);
        XMLNotationDecl::XMLNotationDecl
                  (this_01,(XMLCh *)this_local,pubId,sysId,(XMLCh *)0x0,
                   this->fGrammarPoolMemoryManager);
        XMLNotationDecl::setNameSpaceId(this_01,this->fTargetNSURI);
        (*(this->fSchemaGrammar->super_Grammar).super_XSerializable._vptr_XSerializable[0x12])
                  (this->fSchemaGrammar,this_01);
        if (this->fAnnotation == (XSAnnotation *)0x0) {
          bVar7 = XMLScanner::getGenerateSyntheticAnnotations(this->fScanner);
          if ((bVar7) &&
             (XVar4 = ValueVectorOf<xercesc_4_0::DOMNode_*>::size(this->fNonXSAttList), XVar4 != 0))
          {
            pXVar6 = generateSyntheticAnnotation
                               (this,(DOMElement *)nsMgr.fSchemaInfo,this->fNonXSAttList);
            this->fAnnotation = pXVar6;
            SchemaGrammar::putAnnotation(this->fSchemaGrammar,this_01,this->fAnnotation);
          }
        }
        else {
          SchemaGrammar::putAnnotation(this->fSchemaGrammar,this_01,this->fAnnotation);
        }
      }
    }
    else {
      reportSchemaError(this,(DOMElement *)nsMgr.fSchemaInfo,(XMLCh *)XMLUni::fgXMLErrDomain,0x35,
                        (XMLCh *)SchemaSymbols::fgELT_NOTATION,(XMLCh *)this_local,(XMLCh *)0x0,
                        (XMLCh *)0x0);
      this_local = (TraverseSchema *)0x0;
    }
  }
  NamespaceScopeManager::~NamespaceScopeManager((NamespaceScopeManager *)local_30);
  return (XMLCh *)this_local;
}

Assistant:

const XMLCh* TraverseSchema::traverseNotationDecl(const DOMElement* const elem) {

    NamespaceScopeManager nsMgr(elem, fSchemaInfo, this);

    // -----------------------------------------------------------------------
    // Check attributes
    // -----------------------------------------------------------------------
    fAttributeCheck.checkAttributes(
        elem, GeneralAttributeCheck::E_Notation, this, true, fNonXSAttList
    );

    // -----------------------------------------------------------------------
    // Process notation attributes/elements
    // -----------------------------------------------------------------------
    const XMLCh* name = getElementAttValue(elem, SchemaSymbols::fgATT_NAME, DatatypeValidator::NCName);
    bool         nameEmpty = (!name || !*name) ? true : false;

    if (nameEmpty) {
        reportSchemaError(elem, XMLUni::fgXMLErrDomain, XMLErrs::NoNameGlobalElement,
                          SchemaSymbols::fgELT_NOTATION);
        return 0;
    }

    if (!XMLChar1_0::isValidNCName(name, XMLString::stringLen(name))) {
        reportSchemaError(elem, XMLUni::fgXMLErrDomain, XMLErrs::InvalidDeclarationName,
                          SchemaSymbols::fgELT_NOTATION, name);
        return 0;
    }

    if (fNotationRegistry->containsKey(name, fTargetNSURI)) {
        return name;
    }

    if (checkContent(elem, XUtil::getFirstChildElement(elem), true) != 0)
        reportSchemaError(elem, XMLUni::fgXMLErrDomain, XMLErrs::OnlyAnnotationExpected);

    const XMLCh* publicId = getElementAttValue(elem, SchemaSymbols::fgATT_PUBLIC);
    const XMLCh* systemId = getElementAttValue(elem, SchemaSymbols::fgATT_SYSTEM, DatatypeValidator::AnyURI);

    fNotationRegistry->put((void*) fStringPool->getValueForId(fStringPool->addOrFind(name)),
                           fTargetNSURI, 0);

    // for PSVI we need to store the notational decl
    XMLNotationDecl* decl = new (fGrammarPoolMemoryManager) XMLNotationDecl
        (
            name,
            publicId,
            systemId,
            0,
            fGrammarPoolMemoryManager
        );
    decl->setNameSpaceId(fTargetNSURI);
    fSchemaGrammar->putNotationDecl(decl);

    if (fAnnotation)
        fSchemaGrammar->putAnnotation(decl, fAnnotation);
    else if (fScanner->getGenerateSyntheticAnnotations() && fNonXSAttList->size())
    {
        fAnnotation = generateSyntheticAnnotation(elem, fNonXSAttList);
        fSchemaGrammar->putAnnotation(decl, fAnnotation);
    }
    return name;
}